

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

cmStateSnapshot * __thiscall
cmState::CreateVariableScopeSnapshot
          (cmStateSnapshot *__return_storage_ptr__,cmState *this,cmStateSnapshot *originSnapshot)

{
  PositionType *this_00;
  cmLinkedTree<cmDefinitions> *pcVar1;
  PositionType PVar2;
  iterator it;
  PositionType PVar3;
  PositionType PVar4;
  bool bVar5;
  ReferenceType pSVar6;
  PointerType pSVar7;
  PointerType pSVar8;
  long lVar9;
  undefined8 *puVar10;
  byte bVar11;
  iterator iVar12;
  SnapshotDataType in_stack_fffffffffffffef8;
  PositionType pos;
  
  bVar11 = 0;
  this_00 = &originSnapshot->Position;
  it.Tree = (originSnapshot->Position).Tree;
  it.Position = (originSnapshot->Position).Position;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator*(this_00);
  puVar10 = (undefined8 *)&stack0xfffffffffffffef8;
  for (lVar9 = 0x18; lVar9 != 0; lVar9 = lVar9 + -1) {
    *puVar10 = (pSVar6->ScopeParent).Tree;
    pSVar6 = (ReferenceType)((long)pSVar6 + (ulong)bVar11 * -0x10 + 8);
    puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
  }
  pos = cmLinkedTree<cmStateDetail::SnapshotDataType>::Push_impl
                  (&this->SnapshotData,it,in_stack_fffffffffffffef8);
  pSVar7 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
  PVar3 = (originSnapshot->Position).Position;
  (pSVar7->ScopeParent).Tree = (originSnapshot->Position).Tree;
  (pSVar7->ScopeParent).Position = PVar3;
  pSVar7 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
  pSVar7->SnapshotType = VariableScopeType;
  pSVar7 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
  pSVar7->Keep = false;
  pSVar7 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
  PVar4 = (pSVar7->Policies).Position;
  (pSVar8->PolicyScope).Tree = (pSVar7->Policies).Tree;
  (pSVar8->PolicyScope).Position = PVar4;
  pSVar7 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  bVar5 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar7->Vars);
  if (bVar5) {
    pSVar7 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    pcVar1 = (pSVar7->Vars).Tree;
    PVar2 = (pSVar7->Vars).Position;
    iVar12 = pSVar7->Vars;
    pSVar7 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
    (pSVar7->Parent).Tree = pcVar1;
    (pSVar7->Parent).Position = PVar2;
    iVar12 = cmLinkedTree<cmDefinitions>::Push(&this->VarTree,iVar12);
    pSVar7 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
    pSVar7->Vars = iVar12;
    pSVar7 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
    bVar5 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar7->Vars);
    if (bVar5) {
      cmStateSnapshot::cmStateSnapshot(__return_storage_ptr__,this,pos);
      return __return_storage_ptr__;
    }
    __assert_fail("pos->Vars.IsValid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmState.cxx"
                  ,0x2dc,
                  "cmStateSnapshot cmState::CreateVariableScopeSnapshot(const cmStateSnapshot &)");
  }
  __assert_fail("originSnapshot.Position->Vars.IsValid()",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmState.cxx"
                ,0x2d7,
                "cmStateSnapshot cmState::CreateVariableScopeSnapshot(const cmStateSnapshot &)");
}

Assistant:

cmStateSnapshot cmState::CreateVariableScopeSnapshot(
  cmStateSnapshot const& originSnapshot)
{
  cmStateDetail::PositionType pos =
    this->SnapshotData.Push(originSnapshot.Position, *originSnapshot.Position);
  pos->ScopeParent = originSnapshot.Position;
  pos->SnapshotType = cmStateEnums::VariableScopeType;
  pos->Keep = false;
  pos->PolicyScope = originSnapshot.Position->Policies;
  assert(originSnapshot.Position->Vars.IsValid());

  cmLinkedTree<cmDefinitions>::iterator origin = originSnapshot.Position->Vars;
  pos->Parent = origin;
  pos->Vars = this->VarTree.Push(origin);
  assert(pos->Vars.IsValid());
  return cmStateSnapshot(this, pos);
}